

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_00;
  cmGeneratedFileStream *pcVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  undefined1 useWatcomQuote_00;
  char *pcVar7;
  pointer pbVar8;
  string currentBinDir;
  string object;
  allocator local_99;
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  pcVar1 = this->LocalGenerator;
  local_78 = variableNameExternal;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string((string *)&local_98,"_OBJECTS",(allocator *)&local_70);
  psVar6 = &local_98;
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_50,pcVar1,psVar3,psVar6);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,"# Object files for target ");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,(string *)variableName);
  std::operator<<(poVar4," =");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string
            ((string *)&local_98,"CMAKE_MAKE_LINE_CONTINUE",(allocator *)&local_70);
  pcVar5 = cmMakefile::GetDefinition(this_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pcVar7 = "\\";
  if (pcVar5 != (char *)0x0) {
    pcVar7 = pcVar5;
  }
  for (pbVar8 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 != (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
    poVar4 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::operator<<(poVar4,"\n");
    pcVar2 = this->BuildFileStream;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath_abi_cxx11_
              (&local_98,(cmLocalUnixMakefileGenerator3 *)(pbVar8->_M_dataplus)._M_p,
               (char *)(ulong)useWatcomQuote,SUB81(psVar6,0));
    std::operator<<((ostream *)pcVar2,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::operator<<((ostream *)this->BuildFileStream,"\n");
  pcVar1 = this->LocalGenerator;
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::string((string *)&local_70,"_EXTERNAL_OBJECTS",&local_99);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_98,pcVar1,psVar6,&local_70);
  std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  poVar4 = std::operator<<(poVar4,"# External object files for target ");
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,(string *)local_78);
  std::operator<<(poVar4," =");
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&local_98,pcVar5,(allocator *)&local_70);
  for (pbVar8 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 != (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
    psVar6 = pbVar8;
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_70,this->LocalGenerator,&local_98,pbVar8);
    useWatcomQuote_00 = SUB81(psVar6,0);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar4 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::operator<<(poVar4,"\n");
    pcVar2 = this->BuildFileStream;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath_abi_cxx11_
              (&local_70,(cmLocalUnixMakefileGenerator3 *)(pbVar8->_M_dataplus)._M_p,
               (char *)(ulong)useWatcomQuote,(bool)useWatcomQuote_00);
    std::operator<<((ostream *)pcVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const char* lineContinue =
    this->Makefile->GetDefinition("CMAKE_MAKE_LINE_CONTINUE");
  if (!lineContinue) {
    lineContinue = "\\";
  }
  for (std::vector<std::string>::const_iterator i = this->Objects.begin();
       i != this->Objects.end(); ++i) {
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream << this->LocalGenerator->ConvertToQuotedOutputPath(
      i->c_str(), useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::vector<std::string>::const_iterator i =
         this->ExternalObjects.begin();
       i != this->ExternalObjects.end(); ++i) {
    object =
      this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, *i);
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream << this->LocalGenerator->ConvertToQuotedOutputPath(
      i->c_str(), useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}